

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run.cpp
# Opt level: O2

void __thiscall setup::run_entry::load(run_entry *this,istream *is,info *i)

{
  bitset<256UL> *pbVar1;
  istream **this_00;
  bool bVar2;
  byte bVar3;
  uint16_t uVar4;
  uint uVar5;
  wait_condition wVar6;
  logger *plVar7;
  flag_type fVar8;
  stored_flag_reader<flags<setup::run_entry::flags_Enum_,_12UL>_> flagreader;
  
  if ((i->version).value < 0x1030000) {
    util::load<int,util::little_endian>(is);
  }
  flagreader.super_stored_flag_reader<setup::run_entry::flags_Enum_>.pad_bits = (size_t)&this->name;
  pbVar1 = &(i->header).lead_bytes;
  flagreader.super_stored_flag_reader<setup::run_entry::flags_Enum_>.stream =
       (istream *)
       CONCAT44(flagreader.super_stored_flag_reader<setup::run_entry::flags_Enum_>.stream._4_4_,
                i->codepage);
  flagreader.super_stored_flag_reader<setup::run_entry::flags_Enum_>.pos = (size_t)pbVar1;
  util::operator>>(is,(encoded_string *)&flagreader);
  flagreader.super_stored_flag_reader<setup::run_entry::flags_Enum_>.pad_bits =
       (size_t)&this->parameters;
  flagreader.super_stored_flag_reader<setup::run_entry::flags_Enum_>.stream =
       (istream *)
       CONCAT44(flagreader.super_stored_flag_reader<setup::run_entry::flags_Enum_>.stream._4_4_,
                i->codepage);
  flagreader.super_stored_flag_reader<setup::run_entry::flags_Enum_>.pos = (size_t)pbVar1;
  util::operator>>(is,(encoded_string *)&flagreader);
  flagreader.super_stored_flag_reader<setup::run_entry::flags_Enum_>.pad_bits =
       (size_t)&this->working_dir;
  flagreader.super_stored_flag_reader<setup::run_entry::flags_Enum_>.stream =
       (istream *)
       CONCAT44(flagreader.super_stored_flag_reader<setup::run_entry::flags_Enum_>.stream._4_4_,
                i->codepage);
  flagreader.super_stored_flag_reader<setup::run_entry::flags_Enum_>.pos = (size_t)pbVar1;
  util::operator>>(is,(encoded_string *)&flagreader);
  if ((i->version).value < 0x1030900) {
    (this->run_once_id)._M_string_length = 0;
    *(this->run_once_id)._M_dataplus._M_p = '\0';
  }
  else {
    flagreader.super_stored_flag_reader<setup::run_entry::flags_Enum_>.pad_bits =
         (size_t)&this->run_once_id;
    flagreader.super_stored_flag_reader<setup::run_entry::flags_Enum_>.stream =
         (istream *)
         CONCAT44(flagreader.super_stored_flag_reader<setup::run_entry::flags_Enum_>.stream._4_4_,
                  i->codepage);
    flagreader.super_stored_flag_reader<setup::run_entry::flags_Enum_>.pos = 0;
    util::operator>>(is,(encoded_string *)&flagreader);
  }
  if ((i->version).value < 0x2000200) {
    (this->status_message)._M_string_length = 0;
    *(this->status_message)._M_dataplus._M_p = '\0';
  }
  else {
    flagreader.super_stored_flag_reader<setup::run_entry::flags_Enum_>.pad_bits =
         (size_t)&this->status_message;
    flagreader.super_stored_flag_reader<setup::run_entry::flags_Enum_>.stream =
         (istream *)
         CONCAT44(flagreader.super_stored_flag_reader<setup::run_entry::flags_Enum_>.stream._4_4_,
                  i->codepage);
    flagreader.super_stored_flag_reader<setup::run_entry::flags_Enum_>.pos = 0;
    util::operator>>(is,(encoded_string *)&flagreader);
  }
  if ((i->version).value < 0x5010d00) {
    (this->verb)._M_string_length = 0;
    *(this->verb)._M_dataplus._M_p = '\0';
  }
  else {
    flagreader.super_stored_flag_reader<setup::run_entry::flags_Enum_>.pad_bits =
         (size_t)&this->verb;
    flagreader.super_stored_flag_reader<setup::run_entry::flags_Enum_>.stream =
         (istream *)
         CONCAT44(flagreader.super_stored_flag_reader<setup::run_entry::flags_Enum_>.stream._4_4_,
                  i->codepage);
    flagreader.super_stored_flag_reader<setup::run_entry::flags_Enum_>.pos = 0;
    util::operator>>(is,(encoded_string *)&flagreader);
  }
  if ((i->version).value < 0x2000000) {
    bVar2 = version::is_isx(&i->version);
    if (bVar2) goto LAB_0013a775;
  }
  else {
LAB_0013a775:
    flagreader.super_stored_flag_reader<setup::run_entry::flags_Enum_>.pad_bits =
         (size_t)&this->description;
    flagreader.super_stored_flag_reader<setup::run_entry::flags_Enum_>.stream =
         (istream *)
         CONCAT44(flagreader.super_stored_flag_reader<setup::run_entry::flags_Enum_>.stream._4_4_,
                  i->codepage);
    flagreader.super_stored_flag_reader<setup::run_entry::flags_Enum_>.pos = 0;
    util::operator>>(is,(encoded_string *)&flagreader);
  }
  item::load_condition_data(&this->super_item,is,i);
  windows_version_range::load(&(this->super_item).winver,is,&i->version);
  uVar5 = 0;
  if (0x10317ff < (i->version).value) {
    uVar5 = util::load<int,util::little_endian>(is);
  }
  this->show_command = uVar5;
  bVar3 = util::load<unsigned_char,util::little_endian>(is);
  if (bVar3 < 3) {
    wVar6 = *(wait_condition *)
             ((anonymous_namespace)::stored_run_wait_condition::values + (ulong)bVar3 * 4);
  }
  else {
    this_00 = &flagreader.super_stored_flag_reader<setup::run_entry::flags_Enum_>.stream;
    flagreader.super_stored_flag_reader<setup::run_entry::flags_Enum_>.pad_bits =
         CONCAT44(flagreader.super_stored_flag_reader<setup::run_entry::flags_Enum_>.pad_bits._4_4_,
                  2);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)this_00);
    std::operator<<((ostream *)this_00,"Unexpected ");
    plVar7 = logger::operator<<((logger *)&flagreader,
                                &enum_names<setup::run_entry::wait_condition>::name);
    std::operator<<((ostream *)&plVar7->buffer," value: ");
    std::ostream::_M_insert<unsigned_long>((ulong)&plVar7->buffer);
    logger::~logger((logger *)&flagreader);
    wVar6 = WaitUntilTerminated;
  }
  this->wait = wVar6;
  uVar4 = version::bits(&i->version);
  flagreader.super_stored_flag_reader<setup::run_entry::flags_Enum_>.pad_bits = (size_t)uVar4;
  flagreader.super_stored_flag_reader<setup::run_entry::flags_Enum_>.pos = 0;
  flagreader.super_stored_flag_reader<setup::run_entry::flags_Enum_>.buffer = '\0';
  flagreader.super_stored_flag_reader<setup::run_entry::flags_Enum_>.result._flags.
  super__Base_bitset<1UL>._M_w = (Type)(_Base_bitset<1UL>)0x0;
  flagreader.super_stored_flag_reader<setup::run_entry::flags_Enum_>.bytes = 0;
  flagreader.super_stored_flag_reader<setup::run_entry::flags_Enum_>.stream = is;
  if ((i->version).value < 0x1020300) {
LAB_0013a895:
    bVar2 = version::is_isx(&i->version);
    if (bVar2) {
      if ((i->version).value < 0x1030800) goto LAB_0013a967;
      goto LAB_0013a8ae;
    }
  }
  else {
    stored_flag_reader<setup::data_entry::flags_Enum_>::add
              ((stored_flag_reader<setup::data_entry::flags_Enum_> *)&flagreader,VersionInfoValid);
    if ((i->version).value < 0x1030900) goto LAB_0013a895;
LAB_0013a8ae:
    stored_flag_reader<setup::data_entry::flags_Enum_>::add
              ((stored_flag_reader<setup::data_entry::flags_Enum_> *)&flagreader,VersionInfoNotValid
              );
  }
  if (0x1ffffff < (i->version).value) {
    stored_flag_reader<setup::data_entry::flags_Enum_>::add
              ((stored_flag_reader<setup::data_entry::flags_Enum_> *)&flagreader,TimeStampInUTC);
    stored_flag_reader<setup::data_entry::flags_Enum_>::add
              ((stored_flag_reader<setup::data_entry::flags_Enum_> *)&flagreader,IsUninstallerExe);
    stored_flag_reader<setup::data_entry::flags_Enum_>::add
              ((stored_flag_reader<setup::data_entry::flags_Enum_> *)&flagreader,
               CallInstructionOptimized);
    stored_flag_reader<setup::data_entry::flags_Enum_>::add
              ((stored_flag_reader<setup::data_entry::flags_Enum_> *)&flagreader,Touch);
    if (0x20007ff < (i->version).value) {
      stored_flag_reader<setup::data_entry::flags_Enum_>::add
                ((stored_flag_reader<setup::data_entry::flags_Enum_> *)&flagreader,ChunkEncrypted);
      if (0x50109ff < (i->version).value) {
        stored_flag_reader<setup::data_entry::flags_Enum_>::add
                  ((stored_flag_reader<setup::data_entry::flags_Enum_> *)&flagreader,ChunkCompressed
                  );
        stored_flag_reader<setup::data_entry::flags_Enum_>::add
                  ((stored_flag_reader<setup::data_entry::flags_Enum_> *)&flagreader,SolidBreak);
        if (0x501ffff < (i->version).value) {
          stored_flag_reader<setup::data_entry::flags_Enum_>::add
                    ((stored_flag_reader<setup::data_entry::flags_Enum_> *)&flagreader,Sign);
          if (0x600ffff < (i->version).value) {
            stored_flag_reader<setup::data_entry::flags_Enum_>::add
                      ((stored_flag_reader<setup::data_entry::flags_Enum_> *)&flagreader,SignOnce);
            if (0x602ffff < (i->version).value) {
              stored_flag_reader<setup::data_entry::flags_Enum_>::add
                        ((stored_flag_reader<setup::data_entry::flags_Enum_> *)&flagreader,BZipped);
            }
          }
        }
      }
    }
  }
LAB_0013a967:
  fVar8 = stored_flag_reader<setup::data_entry::flags_Enum_>::finalize
                    ((stored_flag_reader<setup::data_entry::flags_Enum_> *)&flagreader);
  (this->options)._flags.super__Base_bitset<1UL>._M_w =
       (_WordT)fVar8._flags.super__Base_bitset<1UL>._M_w;
  return;
}

Assistant:

void run_entry::load(std::istream & is, const info & i) {
	
	if(i.version < INNO_VERSION(1, 3, 0)) {
		(void)util::load<boost::uint32_t>(is); // uncompressed size of the entry
	}
	
	is >> util::encoded_string(name, i.codepage, i.header.lead_bytes);
	is >> util::encoded_string(parameters, i.codepage, i.header.lead_bytes);
	is >> util::encoded_string(working_dir, i.codepage, i.header.lead_bytes);
	if(i.version >= INNO_VERSION(1, 3, 9)) {
		is >> util::encoded_string(run_once_id, i.codepage);
	} else {
		run_once_id.clear();
	}
	if(i.version >= INNO_VERSION(2, 0, 2)) {
		is >> util::encoded_string(status_message, i.codepage);
	} else {
		status_message.clear();
	}
	if(i.version >= INNO_VERSION(5, 1, 13)) {
		is >> util::encoded_string(verb, i.codepage);
	} else {
		verb.clear();
	}
	if(i.version >= INNO_VERSION(2, 0, 0) || i.version.is_isx()) {
		is >> util::encoded_string(description, i.codepage);
	}
	
	load_condition_data(is, i);
	
	load_version_data(is, i.version);
	
	if(i.version >= INNO_VERSION(1, 3, 24)) {
		show_command = util::load<boost::int32_t>(is);
	} else {
		show_command = 0;
	}
	
	wait = stored_enum<stored_run_wait_condition>(is).get();
	
	stored_flag_reader<flags> flagreader(is, i.version.bits());
	
	if(i.version >= INNO_VERSION(1, 2, 3)) {
		flagreader.add(ShellExec);
	}
	if(i.version >= INNO_VERSION(1, 3, 9) || (i.version.is_isx() && i.version >= INNO_VERSION(1, 3, 8))) {
		flagreader.add(SkipIfDoesntExist);
	}
	if(i.version >= INNO_VERSION(2, 0, 0)) {
		flagreader.add(PostInstall);
		flagreader.add(Unchecked);
		flagreader.add(SkipIfSilent);
		flagreader.add(SkipIfNotSilent);
	}
	if(i.version >= INNO_VERSION(2, 0, 8)) {
		flagreader.add(HideWizard);
	}
	if(i.version >= INNO_VERSION(5, 1, 10)) {
		flagreader.add(Bits32);
		flagreader.add(Bits64);
	}
	if(i.version >= INNO_VERSION(5, 2, 0)) {
		flagreader.add(RunAsOriginalUser);
	}
	if(i.version >= INNO_VERSION(6, 1, 0)) {
		flagreader.add(DontLogParameters);
	}
	if(i.version >= INNO_VERSION(6, 3, 0)) {
		flagreader.add(LogOutput);
	}
	
	options = flagreader.finalize();
}